

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall ON_SimpleArray<ON_3dex>::Insert(ON_SimpleArray<ON_3dex> *this,int i,ON_3dex *x)

{
  int iVar1;
  ON_3dex *pOVar2;
  ON_3dex *memblock;
  int iVar3;
  uint uVar4;
  
  if ((-1 < i) && (i <= this->m_count)) {
    memblock = x;
    if (this->m_count == this->m_capacity) {
      if (x < this->m_a + (uint)this->m_capacity && this->m_a <= x) {
        memblock = (ON_3dex *)onmalloc(0xc);
        iVar1 = x->j;
        memblock->i = x->i;
        memblock->j = iVar1;
        memblock->k = x->k;
      }
      iVar1 = this->m_count;
      if (((long)iVar1 < 8) || ((ulong)((long)iVar1 * 0xc) < 0x10000001)) {
        uVar4 = 4;
        if (2 < iVar1) {
          uVar4 = iVar1 * 2;
        }
      }
      else {
        iVar3 = 0x155555d;
        if (iVar1 < 0x155555d) {
          iVar3 = iVar1;
        }
        uVar4 = iVar3 + iVar1;
      }
      if ((uint)this->m_capacity < uVar4) {
        SetCapacity(this,(long)(int)uVar4);
      }
    }
    iVar1 = this->m_count;
    this->m_count = iVar1 + 1;
    Move(this,i + 1,i,iVar1 - i);
    pOVar2 = this->m_a;
    pOVar2[(uint)i].k = memblock->k;
    iVar1 = memblock->j;
    pOVar2 = pOVar2 + (uint)i;
    pOVar2->i = memblock->i;
    pOVar2->j = iVar1;
    if (memblock != x) {
      onfree(memblock);
      return;
    }
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Insert( int i, const T& x ) 
{
  if( i >= 0 && i <= m_count ) 
  {
    const T* p = &x;
    if ( m_count == m_capacity ) 
    {
      if (&x >= m_a && &x < (m_a + m_capacity))
      {
        // x is in the block of memory about to be reallocated.
        void* temp = onmalloc(sizeof(T));
        memcpy(temp, p, sizeof(T));
        p = (T*)temp;
      }
      int newcapacity = NewCapacity();
      Reserve( newcapacity );
    }
	  m_count++;
    Move( i+1, i, m_count-1-i );
	  m_a[i] = *p;
    if (p != &x)
      onfree((void*)p);
  }
}